

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O1

int png_get_data(png_t *png,uchar *data)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  size_t sVar6;
  uchar *puVar7;
  void *out;
  undefined8 *puVar8;
  uint uVar9;
  size_t in_RCX;
  uchar *puVar10;
  size_t __n;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  uchar *puVar14;
  ulong uVar15;
  uchar uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  long in_FS_OFFSET;
  uint length;
  uint type;
  uint length_1;
  uint type_1;
  uint local_4c;
  int local_48;
  uint local_44;
  uint local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  png->png_data = (uchar *)0x0;
  png->zs = (void *)0x0;
  iVar20 = 0;
LAB_001b0018:
  if (iVar20 == 0) {
    file_read_ul(png,&local_4c);
    sVar6 = file_read(png,&local_48,4,in_RCX);
    iVar20 = -1;
    if (sVar6 == 4) {
      if (local_48 == 0x444e4549) {
        iVar20 = 1;
      }
      else if (local_48 == 0x54414449) {
        if (png->png_data == (uchar *)0x0) {
          uVar9 = png->width * png->height;
          in_RCX = (size_t)uVar9;
          uVar9 = png->bpp * uVar9 + png->height;
          png->png_datalen = uVar9;
          puVar7 = (uchar *)(*png_alloc)((ulong)uVar9);
          png->png_data = puVar7;
          if (puVar7 != (uchar *)0x0) {
            uVar11 = (ulong)local_4c;
            local_3c = 0;
            local_40 = local_4c;
            out = (*png_alloc)(uVar11);
            if (out != (void *)0x0) {
              puVar8 = (undefined8 *)(*png_alloc)(0x70);
              png->zs = puVar8;
              if (puVar8 == (undefined8 *)0x0) {
                iVar20 = -6;
LAB_001b0139:
                bVar2 = false;
              }
              else {
                puVar8[0xc] = 0;
                puVar8[0xd] = 0;
                puVar8[10] = 0;
                puVar8[0xb] = 0;
                puVar8[8] = 0;
                puVar8[9] = 0;
                puVar8[6] = 0;
                puVar8[7] = 0;
                puVar8[4] = 0;
                puVar8[5] = 0;
                puVar8[2] = 0;
                puVar8[3] = 0;
                *puVar8 = 0;
                puVar8[1] = 0;
                iVar3 = inflateInit_(puVar8,"1.2.11",0x70);
                iVar20 = 0;
                if (iVar3 != 0) {
                  iVar20 = -7;
                  goto LAB_001b0139;
                }
                puVar8[3] = png->png_data;
                *(uint *)(puVar8 + 4) = png->png_datalen;
                bVar2 = true;
              }
              if (bVar2) {
                do {
                  sVar6 = file_read(png,out,(ulong)local_40,in_RCX);
                  uVar18 = (ulong)local_40;
                  if (sVar6 != uVar18) {
                    png_end_inflate(png);
                    (*png_free)(out);
                    iVar20 = -1;
                    goto LAB_001b0018;
                  }
                  uVar4 = crc32(0,0,0);
                  uVar4 = crc32(uVar4,"IDAT",4);
                  uVar9 = crc32(uVar4,out,uVar18);
                  file_read_ul(png,&local_44);
                  if (local_44 != uVar9) {
                    iVar20 = -5;
                    goto LAB_001b02c5;
                  }
                  puVar8 = (undefined8 *)png->zs;
                  if (puVar8 == (undefined8 *)0x0) {
                    iVar20 = -6;
                  }
                  else {
                    *puVar8 = out;
                    *(uint *)(puVar8 + 1) = local_40;
                    uVar9 = inflate(puVar8);
                    if (uVar9 < 2) {
                      iVar20 = *(int *)(puVar8 + 1);
                      if (iVar20 != 0) {
                        iVar20 = -7;
                      }
                    }
                    else {
                      __printf_chk(1,"%s\n",puVar8[6]);
                      iVar20 = -7;
                    }
                  }
                  if (iVar20 != 0) goto LAB_001b02c5;
                  file_read_ul(png,&local_40);
                  if ((uint)uVar11 < local_40) {
                    (*png_free)(out);
                    uVar11 = (ulong)local_40;
                    out = (*png_alloc)(uVar11);
                    if (out == (void *)0x0) {
                      png_end_inflate(png);
                      goto LAB_001b02f4;
                    }
                  }
                  sVar6 = file_read(png,&local_3c,4,in_RCX);
                  if (sVar6 != 4) {
                    iVar20 = -1;
                    goto LAB_001b02c5;
                  }
                } while (local_3c == 0x54414449);
                iVar20 = 0;
LAB_001b02c5:
                if (local_3c == 0x444e4549) {
                  iVar20 = 1;
                }
                (*png_free)(out);
                png_end_inflate(png);
              }
              else {
                png_end_inflate(png);
                (*png_free)(out);
              }
              goto LAB_001b0018;
            }
          }
LAB_001b02f4:
          iVar20 = -6;
        }
      }
      else {
        iVar20 = 0;
        file_read(png,(void *)0x0,(ulong)(local_4c + 4),in_RCX);
      }
    }
    goto LAB_001b0018;
  }
  if (iVar20 == 1) {
    puVar7 = png->png_data;
    bVar1 = png->bpp;
    uVar18 = (ulong)bVar1;
    iVar20 = 0;
    uVar11 = 0;
    uVar9 = 0;
    do {
      if (png->png_datalen <= uVar9) goto LAB_001b0575;
      uVar19 = (ulong)uVar9 + 1;
      uVar17 = (uint)bVar1;
      if ((png->depth == '\x10') && (uVar13 = png->width * uVar17, uVar13 != 0)) {
        uVar15 = 0;
        do {
          *(ushort *)(puVar7 + uVar15 + uVar19) =
               CONCAT11(puVar7[(uint)((int)uVar19 + (int)uVar15)],puVar7[uVar9 + 2 + (int)uVar15]);
          uVar15 = uVar15 + 2;
        } while (uVar15 < uVar13);
      }
      if (puVar7[uVar9] < 5) {
        uVar13 = (uint)bVar1;
        iVar3 = (int)uVar11;
        switch(puVar7[uVar9]) {
        case '\0':
          puVar10 = data + uVar11;
          puVar14 = puVar7 + (uVar19 & 0xffffffff);
          __n = (size_t)(png->width * uVar17);
LAB_001b0507:
          memcpy(puVar10,puVar14,__n);
          break;
        case '\x01':
          uVar9 = png->width * uVar17;
          if (0 < (int)uVar9) {
            uVar15 = 0;
            uVar16 = '\0';
            do {
              if (uVar18 <= uVar15) {
                uVar16 = data[uVar15 + -uVar18 + uVar11];
              }
              data[uVar15 + uVar11] = puVar7[uVar15 + uVar19] + uVar16;
              uVar15 = uVar15 + 1;
            } while (uVar9 != uVar15);
          }
          break;
        case '\x02':
          puVar14 = puVar7 + (uVar19 & 0xffffffff);
          if (iVar3 == 0) {
            __n = (size_t)(int)(png->width * uVar13);
            puVar10 = data;
            goto LAB_001b0507;
          }
          uVar9 = png->width * uVar17;
          if (0 < (int)uVar9) {
            uVar15 = 0;
            do {
              data[uVar15 + uVar11] = data[uVar15 + (uVar11 - uVar9)] + puVar14[uVar15];
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar9);
          }
          break;
        case '\x03':
          if (iVar3 == 0) {
            uVar13 = png->width * uVar13;
            if (0 < (int)uVar13) {
              uVar11 = 0;
              bVar12 = 0;
              do {
                if (uVar18 <= uVar11) {
                  bVar12 = data[uVar11 - uVar18];
                }
                data[uVar11] = (bVar12 >> 1) + puVar7[uVar11 + (uVar19 & 0xffffffff)];
                uVar11 = uVar11 + 1;
              } while (uVar13 != uVar11);
            }
          }
          else {
            uVar13 = png->width * uVar13;
            if (0 < (int)uVar13) {
              uVar15 = 0;
              uVar9 = 0;
              do {
                if (uVar18 <= uVar15) {
                  uVar9 = (uint)data[uVar15 + -uVar18 + uVar11];
                }
                data[uVar15 + uVar11] =
                     (char)(uVar9 + data[uVar15 + (uVar11 - uVar13)] >> 1) +
                     puVar7[uVar15 + (uVar19 & 0xffffffff)];
                uVar15 = uVar15 + 1;
              } while (uVar15 != uVar13);
            }
          }
          break;
        case '\x04':
          if (iVar3 == 0) {
            uVar9 = png->width * uVar17;
            puVar10 = (uchar *)0x0;
            puVar14 = data;
            uVar11 = uVar18;
          }
          else {
            uVar9 = png->width * uVar17;
            puVar10 = data + uVar11 + -(ulong)uVar9;
            puVar14 = data + uVar11;
            uVar11 = (ulong)uVar13;
          }
          png_filter_paeth((int)uVar11,puVar7 + (uVar19 & 0xffffffff),puVar14,puVar10,uVar9);
        }
        iVar5 = png->width * uVar17;
        uVar11 = (ulong)(uint)(iVar3 + iVar5);
        bVar2 = true;
        uVar19 = (ulong)(uint)(iVar5 + (int)uVar19);
      }
      else {
        bVar2 = false;
      }
      uVar9 = (uint)uVar19;
    } while (bVar2);
    iVar20 = -8;
LAB_001b0575:
    puVar7 = png->png_data;
  }
  else {
    if (png->png_data != (uchar *)0x0) goto LAB_001b0587;
    puVar7 = (uchar *)0x0;
  }
  (*png_free)(puVar7);
  png->png_data = (uchar *)0x0;
LAB_001b0587:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar20;
}

Assistant:

int png_get_data(png_t* png, unsigned char* data)
{
	int result = PNG_NO_ERROR;
	png->png_data = 0;
	png->zs = 0;

	while(result == PNG_NO_ERROR)
	{
		result = png_process_chunk(png);
	}

	if(result != PNG_DONE)
	{
		if(!png->png_data)
		{
			png_free(png->png_data);
			png->png_data = 0;
		}
		return result;
	}

	result = png_unfilter(png, data);

	png_free(png->png_data); 
	png->png_data = 0;

	return result;
}